

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O1

void __thiscall
glcts::TextureBufferActiveUniformValidation::addTextureParam
          (TextureBufferActiveUniformValidation *this,GLenum uniformType,GLenum format,GLuint size,
          char *name,
          vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_> *params)

{
  TextureParameters texParam;
  TextureParameters local_40;
  
  TextureParameters::TextureParameters(&local_40,size,format,uniformType,name);
  std::vector<glcts::TextureParameters,_std::allocator<glcts::TextureParameters>_>::push_back
            (params,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40.m_uniform_name._M_dataplus._M_p != &local_40.m_uniform_name.field_2) {
    operator_delete(local_40.m_uniform_name._M_dataplus._M_p,
                    local_40.m_uniform_name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TextureBufferActiveUniformValidation::addTextureParam(glw::GLenum uniformType, glw::GLenum format,
														   glw::GLuint size, const char* name,
														   std::vector<TextureParameters>* params)
{
	TextureParameters texParam(size, format, uniformType, name);
	params->push_back(texParam);
}